

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_infer_nedge_nface(REF_GRID ref_grid)

{
  uint uVar1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT local_28;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_id;
  REF_INT min_id;
  REF_GEOM ref_geom;
  REF_GRID ref_grid_local;
  
  _max_id = ref_grid->geom;
  ref_geom = (REF_GEOM)ref_grid;
  uVar1 = ref_cell_id_range(ref_grid->cell[3],ref_grid->mpi,&ref_private_macro_code_rss,&local_28);
  if (uVar1 == 0) {
    if ((long)ref_private_macro_code_rss == 1) {
      _max_id->nface = local_28;
      uVar1 = ref_cell_id_range((REF_CELL)ref_geom->descr,*(REF_MPI *)ref_geom,
                                &ref_private_macro_code_rss,&local_28);
      if (uVar1 == 0) {
        if ((long)ref_private_macro_code_rss == 1) {
          _max_id->nedge = local_28;
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x9a7,"ref_geom_infer_nedge_nface","first edge id not 1",1,
                 (long)ref_private_macro_code_rss);
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x9a6,"ref_geom_infer_nedge_nface",(ulong)uVar1,"edge range");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x9a2,
             "ref_geom_infer_nedge_nface","first face id not 1",1,(long)ref_private_macro_code_rss);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x9a1,
           "ref_geom_infer_nedge_nface",(ulong)uVar1,"face range");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_infer_nedge_nface(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT min_id, max_id;
  RSS(ref_cell_id_range(ref_grid_tri(ref_grid), ref_grid_mpi(ref_grid), &min_id,
                        &max_id),
      "face range");
  REIS(1, min_id, "first face id not 1");
  ref_geom->nface = max_id;
  RSS(ref_cell_id_range(ref_grid_edg(ref_grid), ref_grid_mpi(ref_grid), &min_id,
                        &max_id),
      "edge range");
  REIS(1, min_id, "first edge id not 1");
  ref_geom->nedge = max_id;
  return REF_SUCCESS;
}